

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O2

void __thiscall gl4cts::DirectStateAccess::Queries::DefaultsTest::clean(DefaultsTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_query_dsa != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x458))(1,&this->m_query_dsa);
    this->m_query_dsa = 0;
  }
  return;
}

Assistant:

void DefaultsTest::clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_query_dsa)
	{
		gl.deleteQueries(1, &m_query_dsa);

		m_query_dsa = 0;
	}
}